

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_size_format(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint uVar1;
  int iVar2;
  int local_3c;
  ulong uStack_38;
  int c;
  jx9_int64 iSize;
  sxi32 i_32;
  sxi32 nRest;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  local_3c = -1;
  if (nArg < 1) {
    jx9_result_string(pCtx,"",0);
  }
  else {
    uStack_38 = jx9_value_to_int64(*apArg);
    iVar2 = local_3c;
    if ((long)uStack_38 < 100) {
      jx9_result_string(pCtx,"0.1 KB",6);
    }
    else {
      do {
        local_3c = iVar2;
        uVar1 = (uint)uStack_38;
        uStack_38 = (long)uStack_38 >> 10;
        iVar2 = local_3c + 1;
      } while ((uStack_38 & 0xfffffffffffffc00) != 0);
      iSize._4_4_ = (uVar1 & 0x3ff) / 100;
      if (9 < iSize._4_4_) {
        iSize._4_4_ = 9;
      }
      if (999 < (long)uStack_38) {
        iSize._4_4_ = 9;
        uStack_38 = 0;
        iVar2 = local_3c + 2;
      }
      local_3c = iVar2;
      jx9_result_string_format
                (pCtx,"%d.%d %cB",uStack_38 & 0xffffffff,(ulong)iSize._4_4_,
                 (ulong)(uint)(int)"KMGTPEZ"[local_3c]);
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_size_format(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	/*Kilo*/ /*Mega*/ /*Giga*/ /*Tera*/ /*Peta*/ /*Exa*/ /*Zeta*/
	static const char zUnit[] = {"KMGTPEZ"};
	sxi32 nRest, i_32;
	jx9_int64 iSize;
	int c = -1; /* index in zUnit[] */

	if( nArg < 1 ){
		/* Missing argument, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Extract the given size */
	iSize = jx9_value_to_int64(apArg[0]);
	if( iSize < 100 /* Bytes */ ){
		/* Don't bother formatting, return immediately */
		jx9_result_string(pCtx, "0.1 KB", (int)sizeof("0.1 KB")-1);
		return JX9_OK;
	}
	for(;;){
		nRest = (sxi32)(iSize & 0x3FF); 
		iSize >>= 10;
		c++;
		if( (iSize & (~0 ^ 1023)) == 0 ){
			break;
		}
	}
	nRest /= 100;
	if( nRest > 9 ){
		nRest = 9;
	}
	if( iSize > 999 ){
		c++;
		nRest = 9;
		iSize = 0;
	}
	i_32 = (sxi32)iSize;
	/* Format */
	jx9_result_string_format(pCtx, "%d.%d %cB", i_32, nRest, zUnit[c]);
	return JX9_OK;
}